

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O2

void __thiscall floorplan::GraphStatistics::generateCategoryCountDist(GraphStatistics *this)

{
  StoredVertexList *pSVar1;
  pointer paVar2;
  double *pdVar3;
  mapped_type *pmVar4;
  StoredVertex *sv;
  uint uVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  allocator_type local_71;
  value_type_conflict local_70;
  floorplanGraph G;
  
  for (uVar5 = 0;
      (ulong)uVar5 <
      (ulong)((long)(this->_labels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_labels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    local_70 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&G,1,&local_70,&local_71);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](&this->_categoryCountDistByLabel,
                          (this->_labels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar5);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(pmVar4,&G);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&G);
  }
  uVar5 = 0;
  pSVar1 = &G.super_type.m_vertices;
  while( true ) {
    paVar2 = (this->_database->_graphs).
             super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_database->_graphs).
                       super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0x38) <=
        (ulong)uVar5) break;
    boost::
    adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
    ::adjacency_list(&G,paVar2 + uVar5);
    p_Var6 = G.super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var7 = p_Var6, p_Var6 != (_List_node_base *)pSVar1) {
      for (; p_Var6 = (_List_node_base *)pSVar1, p_Var7 != (_List_node_base *)pSVar1;
          p_Var7 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var7->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](&this->_categoryCountDistByLabel,
                              (key_type *)&p_Var7[1]._M_next[1]._M_prev);
        pdVar3 = (pmVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar3 = *pdVar3 + 1.0;
      }
    }
    boost::
    adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
    ::~adjacency_list(&G);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void GraphStatistics::generateCategoryCountDist(){
    for(unsigned int i = 0; i < _labels.size(); i++)
        _categoryCountDistByLabel[_labels[i]] = vector<double>(1, 0);

    /* Fill up the labels and categoryCount container */
    for (unsigned int i = 0; i < _database->getGraphs().size(); i++){
        floorplanGraph G = _database->getGraphs()[i];
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            _categoryCountDistByLabel[G[v].category][0]++;
        }
    }
}